

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagewindow.cc
# Opt level: O3

void __thiscall bgui::ImageWindow::onMouseMove(ImageWindow *this,int x,int y,int state)

{
  char *text;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *local_40 [2];
  char local_30 [16];
  
  if ((state == 0x21) || (state == 4)) {
    if ((this->adapt != (ImageAdapterBase *)0x0) && (uVar1 = this->imx + x, -1 < (int)uVar1)) {
      iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xb])();
      if (((long)(ulong)uVar1 < CONCAT44(extraout_var,iVar2)) &&
         (uVar1 = this->imy + y, -1 < (int)uVar1)) {
        iVar2 = (*this->adapt->_vptr_ImageAdapterBase[0xc])();
        if ((long)(ulong)uVar1 < CONCAT44(extraout_var_00,iVar2)) {
          this->showinfo = false;
          (*this->adapt->_vptr_ImageAdapterBase[10])
                    (local_40,this->adapt,(long)x + (long)this->imx,(long)y + (long)this->imy);
          text = local_40[0];
          iVar2 = BaseWindow::getTextHeight(&this->super_BaseWindow);
          BaseWindow::setInfoLine(&this->super_BaseWindow,text,iVar2 < y,true);
          if (local_40[0] != local_30) {
            operator_delete(local_40[0]);
          }
        }
      }
    }
  }
  else if (state == 1) {
    this->imx = this->xp - x;
    this->imy = this->yp - y;
    redrawImage(this,true);
    updateInfo(this);
    return;
  }
  return;
}

Assistant:

void ImageWindow::onMouseMove(int x, int y, int state)
{
  // if left button is pressed, then perform panning

  if (state == button1mask)
  {
    imx=xp-x;
    imy=yp-y;

    redrawImage();
    updateInfo();
  }

  if ((state == (button1mask|shiftmask) || state == button3mask) &&
      adapt != 0 && x+imx >= 0 && x+imx < adapt->getWidth() && y+imy >= 0 &&
      y+imy < adapt->getHeight())
  {
    showinfo=false;
    setInfoLine(adapt->getDescriptionOfPixel(x+imx, y+imy).c_str(),
                y > getTextHeight());
  }
}